

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_progress.cpp
# Opt level: O0

void __thiscall libtorrent::aux::file_progress::clear(file_progress *this)

{
  file_progress *this_local;
  
  this->m_total_on_disk = 0;
  ::std::vector<long,_std::allocator<long>_>::clear
            (&(this->m_file_progress).super_vector<long,_std::allocator<long>_>);
  ::std::vector<long,_std::allocator<long>_>::shrink_to_fit
            (&(this->m_file_progress).super_vector<long,_std::allocator<long>_>);
  return;
}

Assistant:

void file_progress::clear()
	{
		INVARIANT_CHECK;
		m_total_on_disk = 0;
		m_file_progress.clear();
		m_file_progress.shrink_to_fit();
#if TORRENT_USE_INVARIANT_CHECKS
		m_have_pieces.clear();
#endif
	}